

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int SDL_InitSubSystem(Uint32 sdl12flags)

{
  int iVar1;
  uint uVar2;
  SDL_bool SVar3;
  SDL_JoystickID SVar4;
  char *pcVar5;
  long lVar6;
  SDL20_GameControllerNameForIndex_t *pp_Var7;
  char *pcVar8;
  SDL20_GameControllerOpen_t *pp_Var9;
  SDL_GameController *pSVar10;
  SDL12_Joystick *pSVar11;
  uint uVar12;
  uint uVar13;
  
  uVar12 = ~InitializedSubsystems20 & sdl12flags;
  uVar13 = (InitializedSubsystems20 & 0x10 | uVar12 & 1) ^ 0x10;
  if ((sdl12flags & 0x10) == 0) {
    uVar13 = uVar12 & 1;
  }
  uVar2 = (InitializedSubsystems20 & 0x20 | uVar13) ^ 0x20;
  if ((sdl12flags & 0x20) == 0) {
    uVar2 = uVar13;
  }
  uVar13 = uVar12 & 0x100200 | uVar2;
  if (((sdl12flags >> 8 & 1) != 0) && (CDRomInit == '\0')) {
    pcVar5 = (*SDL20_getenv)("SDL12COMPAT_FAKE_CDROM_PATH");
    if (pcVar5 != (char *)0x0) {
      CDRomPath = (*SDL20_strdup)(pcVar5);
    }
    CDRomInit = '\x01';
  }
  iVar1 = (*SDL20_Init)(uVar13);
  if (iVar1 == 0) {
    iVar1 = 0;
    if ((uVar2 & 0x20) != 0) {
      iVar1 = Init12Video();
      EventThreadEnabled = sdl12flags >> 0x18 & SDL_TRUE;
    }
    if ((iVar1 == 0) && ((uVar2 & 0x10) != 0)) {
      pcVar5 = (*SDL20_getenv)("SDL12COMPAT_COMPATIBILITY_AUDIOCVT");
      if (pcVar5 == (char *)0x0) {
        WantCompatibilityAudioCVT = SDL_FALSE;
      }
      else {
        lVar6 = (*SDL20_strtol)(pcVar5,(char **)0x0,10);
        WantCompatibilityAudioCVT = (SDL_bool)((int)lVar6 != 0);
      }
    }
    if ((iVar1 == 0) && ((uVar12 & 0x200) != 0)) {
      pcVar5 = (*SDL20_getenv)("SDL12COMPAT_USE_GAME_CONTROLLERS");
      if (pcVar5 == (char *)0x0) {
        JoysticksAreGameControllers = SDL_FALSE;
      }
      else {
        lVar6 = (*SDL20_strtol)(pcVar5,(char **)0x0,10);
        JoysticksAreGameControllers = (SDL_bool)((int)lVar6 != 0);
      }
      NumJoysticks = 0;
      (*SDL20_LockJoysticks)();
      uVar2 = (*SDL20_NumJoysticks)();
      uVar12 = 0xff;
      if ((int)uVar2 < 0xff) {
        uVar12 = uVar2;
      }
      if ((int)uVar2 < 1) {
        JoystickList = (SDL12_Joystick *)0x0;
      }
      else {
        JoystickList = (SDL12_Joystick *)(*SDL20_calloc)((ulong)uVar12,0x18);
        if (JoystickList != (SDL12_Joystick *)0x0) {
          uVar2 = 0;
          do {
            if (JoysticksAreGameControllers == SDL_FALSE) {
LAB_00107f31:
              pp_Var7 = &SDL20_JoystickNameForIndex;
LAB_00107f38:
              pcVar8 = (**pp_Var7)(uVar2);
              pcVar5 = "Generic SDL2 Game Controller";
              if (JoysticksAreGameControllers == SDL_FALSE) {
                pcVar5 = "Generic SDL2 Joystick";
              }
              if (pcVar8 != (char *)0x0) {
                pcVar5 = pcVar8;
              }
              pcVar5 = (*SDL20_strdup)(pcVar5);
              JoystickList[NumJoysticks].name = pcVar5;
              if (pcVar5 != (char *)0x0) {
                pp_Var9 = &SDL20_GameControllerOpen;
                if (JoysticksAreGameControllers == SDL_FALSE) {
                  pp_Var9 = (SDL20_GameControllerOpen_t *)&SDL20_JoystickOpen;
                }
                pSVar10 = (**pp_Var9)(uVar2);
                pSVar11 = JoystickList;
                lVar6 = (long)NumJoysticks;
                JoystickList[lVar6].dev.controller = pSVar10;
                if (pSVar10 == (SDL_GameController *)0x0) {
                  (*SDL20_free)(pSVar11[lVar6].name);
                  JoystickList[NumJoysticks].name = (char *)0x0;
                }
                SVar4 = (*SDL20_JoystickGetDeviceInstanceID)(uVar2);
                JoystickList[NumJoysticks].instance_id = SVar4;
                NumJoysticks = NumJoysticks + 1;
              }
            }
            else {
              SVar3 = (*SDL20_IsGameController)(uVar2);
              if (SVar3 != SDL_FALSE) {
                pp_Var7 = &SDL20_GameControllerNameForIndex;
                if (JoysticksAreGameControllers == SDL_FALSE) goto LAB_00107f31;
                goto LAB_00107f38;
              }
            }
            uVar2 = uVar2 + 1;
          } while (uVar12 != uVar2);
        }
      }
      (*SDL20_UnlockJoysticks)();
      if (JoystickList == (SDL12_Joystick *)0x0 || (long)NumJoysticks != 0) {
        if (((int)uVar12 <= NumJoysticks) ||
           (pSVar11 = (SDL12_Joystick *)(*SDL20_realloc)(JoystickList,(long)NumJoysticks * 0x18),
           pSVar11 == (SDL12_Joystick *)0x0)) goto LAB_00107dfb;
      }
      else {
        (*SDL20_free)(JoystickList);
        pSVar11 = (SDL12_Joystick *)0x0;
      }
      JoystickList = pSVar11;
    }
  }
LAB_00107dfb:
  InitializedSubsystems20 = InitializedSubsystems20 | uVar13;
  return iVar1;
}

Assistant:

SDLCALL
SDL_InitSubSystem(Uint32 sdl12flags)
{
    Uint32 sdl20flags = 0;
    int rc;

#ifdef __WINDOWS__
    /* DOSBox (and probably other things), try to force the "windib" video
       backend, but it doesn't exist in SDL2. Force to "windows" instead. */
    const char *origvidenv = NULL;
    const char *env = SDL20_getenv("SDL_VIDEODRIVER");
    if (env) {
        if (SDL20_strcmp(env, "windib") == 0) {
            origvidenv = "windib";
            SDL20_setenv("SDL_VIDEODRIVER", "windows", 1);
        } else
        if (SDL20_strcmp(env, "directx") == 0) {
            origvidenv = "directx";
            SDL20_setenv("SDL_VIDEODRIVER", "windows", 1);
        }
    }
#endif

#ifdef __MACOSX__
    extern void sdl12_compat_macos_init(void);
    sdl12_compat_macos_init();
#endif

    /* note that currently we ignore SDL12_INIT_NOPARACHUTE, since
       there _isn't_ a parachute in SDL2, and mostly it was meant to deal
       with X11's XVidMode leaving the display resolution busted if the app
       didn't call SDL_Quit() before leaving...but most sdl12-compat cases
       (except OpenGL rendering without logical scaling) use
       FULLSCREEN_DESKTOP for fullscreen modes, and modern X11 doesn't
       have this problem, so we're ignoring the parachute until a reasonable
       need arises. */

    #define SETFLAG(flag) { \
        const Uint32 f12 = SDL12_INIT_##flag; \
        const Uint32 f20 = SDL_INIT_##flag; \
        if ((sdl12flags & f12) && ((InitializedSubsystems20 & f20) == 0)) { \
            sdl20flags |= f20; \
        } \
    }

    SETFLAG(TIMER);
    SETFLAG(AUDIO);
    SETFLAG(VIDEO);
    SETFLAG(JOYSTICK);
    SETFLAG(NOPARACHUTE);
    #undef SETFLAG

    /* There's no CDROM in 2.0, but we fake it. */
    if (sdl12flags & SDL12_INIT_CDROM) {
        /* this never reports failure, even if there's a legit problem. You just won't see any drives. */
        InitializeCDSubsystem();
    }

    rc = SDL20_Init(sdl20flags);
    if ((rc == 0) && (sdl20flags & SDL_INIT_VIDEO)) {
        if (Init12Video() < 0) {
            rc = -1;
        }

        /* SDL_INIT_EVENTTHREAD takes effect when SDL_INIT_VIDEO is also set */
        EventThreadEnabled = (sdl12flags & SDL12_INIT_EVENTTHREAD) ? SDL_TRUE : SDL_FALSE;
    }

#ifdef __WINDOWS__
    if (origvidenv) {  /* set this back to minimize surprise state changes. */
        SDL20_setenv("SDL_VIDEODRIVER", origvidenv, 1);
    }
#endif

    if ((rc == 0) && (sdl20flags & SDL_INIT_AUDIO)) {
        Init12Audio();
    }

    if ((rc == 0) && (sdl20flags & SDL_INIT_JOYSTICK)) {
        Init12Joystick();  /* if this fails, we just won't report any sticks. */
    }

    InitializedSubsystems20 |= sdl20flags;

    return rc;
}